

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

_Bool seq_from(Env *env,char *s,uint32_t start)

{
  char cVar1;
  State *pSVar2;
  size_t sVar3;
  uint uVar4;
  TSLexer *pTVar5;
  uint32_t uVar6;
  ulong uVar7;
  _Bool _Var8;
  bool bVar9;
  
  sVar3 = strlen(s);
  if ((int)sVar3 != 0) {
    _Var8 = false;
    uVar7 = 1;
    uVar6 = start;
    do {
      cVar1 = s[uVar7 - 1];
      pSVar2 = env->state;
      uVar4 = (pSVar2->lookahead).offset + uVar6;
      if (uVar4 < (pSVar2->lookahead).size) {
        pTVar5 = (TSLexer *)((pSVar2->lookahead).contents + uVar4);
      }
      else {
        advance_before(env,uVar6);
        pTVar5 = env->lexer;
      }
      if (pTVar5->lookahead != (int)cVar1) {
        return _Var8;
      }
      _Var8 = (sVar3 & 0xffffffff) <= uVar7;
      uVar6 = uVar6 + 1;
      bVar9 = uVar7 != (sVar3 & 0xffffffff);
      uVar7 = uVar7 + 1;
    } while (bVar9);
  }
  uVar6 = start + (int)sVar3;
  if ((env->state->lookahead).size <= (env->state->lookahead).offset + uVar6) {
    advance_before(env,uVar6);
  }
  return true;
}

Assistant:

static bool seq_from(Env *env, const char *restrict s, uint32_t start) {
  uint32_t len = (uint32_t) strlen(s);
  for (uint32_t i = 0; i < len; i++) {
    int32_t c = s[i];
    int32_t c2 = peek(env, start + i);
    if (c != c2) return false;
  }
  peek(env, start + len);
  return true;
}